

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffphprll(fitsfile *fptr,int simple,int bitpix,int naxis,LONGLONG *naxes,LONGLONG pcount,
            LONGLONG gcount,int extend,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  LONGLONG LStack_1a0;
  char comm [73];
  long tnaxes [20];
  char name [75];
  
  if (0 < *status) {
    return *status;
  }
  iVar1 = fptr->HDUposition;
  pFVar2 = fptr->Fptr;
  if (iVar1 != pFVar2->curhdu) {
    ffmahd(fptr,iVar1 + 1,(int *)0x0,status);
    pFVar2 = fptr->Fptr;
    iVar1 = pFVar2->curhdu;
  }
  if (pFVar2->headend != pFVar2->headstart[iVar1]) {
    *status = 0xc9;
    return 0xc9;
  }
  if ((naxis != 0) && (pFVar2->request_compress_type != 0)) {
    uVar3 = 0;
    uVar4 = 0;
    if (0 < naxis) {
      uVar4 = (ulong)(uint)naxis;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      tnaxes[uVar3] = naxes[uVar3];
    }
    imcomp_init_table(fptr,bitpix,naxis,tnaxes,1,status);
    goto LAB_001a35de;
  }
  if (iVar1 == 0) {
    if (simple == 0) {
      builtin_strncpy(comm + 8,"s not conform to FITS standard",0x1f);
    }
    else {
      builtin_strncpy(comm + 8,"s conform to FITS standard",0x1b);
    }
    builtin_strncpy(comm,"file doe",8);
    ffpkyl(fptr,"SIMPLE",simple,comm,status);
  }
  else {
    builtin_strncpy(comm,"IMAGE extension",0xf);
    comm._15_4_ = comm._15_4_ & 0xffffff00;
    ffpkys(fptr,"XTENSION","IMAGE",comm,status);
  }
  if (bitpix == 0x14) {
    LStack_1a0 = 0x10;
  }
  else if (bitpix == 0x50) {
    LStack_1a0 = 0x40;
  }
  else if (bitpix == 0x28) {
    LStack_1a0 = 0x20;
  }
  else {
    iVar1 = 8;
    if (bitpix != 10) {
      iVar1 = bitpix;
    }
    LStack_1a0 = (LONGLONG)iVar1;
    if ((((0x38 < iVar1 - 8U) || ((0x100000001000101U >> ((ulong)(iVar1 - 8U) & 0x3f) & 1) == 0)) &&
        (iVar1 != -0x40)) && (iVar1 != -0x20)) {
      snprintf((char *)tnaxes,0x51,"Illegal value for BITPIX keyword: %d",(ulong)(uint)bitpix);
      ffpmsg((char *)tnaxes);
      *status = 0xd3;
      return 0xd3;
    }
  }
  builtin_strncpy(comm,"number of bits per data pixel",0x1e);
  iVar1 = ffpkyj(fptr,"BITPIX",LStack_1a0,comm,status);
  if (0 < iVar1) goto LAB_001a35de;
  if (999 < (uint)naxis) {
    snprintf((char *)tnaxes,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxis);
    ffpmsg((char *)tnaxes);
    *status = 0xd4;
    return 0xd4;
  }
  builtin_strncpy(comm,"number of data axes",0x14);
  ffpkyj(fptr,"NAXIS",(ulong)(uint)naxis,comm,status);
  builtin_strncpy(comm,"length of data axis ",0x15);
  uVar3 = 0;
  while ((uint)naxis != uVar3) {
    if (naxes[uVar3] < 0) {
      snprintf((char *)tnaxes,0x51,"Illegal negative value for NAXIS%d keyword: %.0f",
               SUB84((double)naxes[uVar3],0),(ulong)((int)uVar3 + 1));
      ffpmsg((char *)tnaxes);
      *status = 0xd5;
      return 0xd5;
    }
    uVar4 = uVar3 + 1;
    snprintf(comm + 0x14,0x35,"%d",uVar4 & 0xffffffff);
    ffkeyn("NAXIS",(int)uVar4,name,status);
    ffpkyj(fptr,name,naxes[uVar3],comm,status);
    uVar3 = uVar4;
  }
  if (fptr->Fptr->curhdu == 0) {
    if (extend != 0) {
      builtin_strncpy(comm,"FITS dataset may contain extensions",0x23);
      comm._35_4_ = comm._35_4_ & 0xffffff00;
      ffpkyl(fptr,"EXTEND",extend,comm,status);
    }
    if (pcount < 0) {
      ffpmsg("pcount value is less than 0");
      *status = 0xd6;
      return 0xd6;
    }
    if (gcount < 1) {
      ffpmsg("gcount value is less than 1");
      *status = 0xd7;
      return 0xd7;
    }
    if (gcount != 1 || pcount != 0) {
      builtin_strncpy(comm,"random group records are present",0x21);
      ffpkyl(fptr,"GROUPS",1,comm,status);
      builtin_strncpy(comm,"number of random group parameters",0x22);
      ffpkyj(fptr,"PCOUNT",pcount,comm,status);
      builtin_strncpy(comm,"number of random groups",0x18);
LAB_001a394c:
      ffpkyj(fptr,"GCOUNT",gcount,comm,status);
    }
  }
  else if (pcount == 0) {
    if (gcount == 1) {
      builtin_strncpy(comm,"required keyword; must = 0",0x1b);
      ffpkyj(fptr,"PCOUNT",0,comm,status);
      builtin_strncpy(comm,"required keyword; must = 1",0x1b);
      gcount = 1;
      goto LAB_001a394c;
    }
    ffpmsg("image extensions must have gcount = 1");
    *status = 0xd7;
  }
  else {
    ffpmsg("image extensions must have pcount = 0");
    *status = 0xd6;
  }
  if (bitpix == 10) {
    builtin_strncpy(comm + 0x1c," signed byte",0xd);
    uVar5 = 0xc0600000;
LAB_001a3a59:
    builtin_strncpy(comm,"offset data range to that of",0x1c);
    ffpkyg(fptr,"BZERO",(double)((ulong)uVar5 << 0x20),0,comm,status);
  }
  else {
    if (bitpix != 0x50) {
      if (bitpix == 0x28) {
        builtin_strncpy(comm + 0x1c," unsigned long",0xf);
        uVar5 = 0x41e00000;
      }
      else {
        if (bitpix != 0x14) goto LAB_001a35de;
        builtin_strncpy(comm + 0x1c," unsigned short",0x10);
        uVar5 = 0x40e00000;
      }
      goto LAB_001a3a59;
    }
    ffprec(fptr,"BZERO   =  9223372036854775808 / offset data range to that of unsigned long long",
           status);
  }
  builtin_strncpy(comm,"default scaling factor",0x17);
  ffpkyg(fptr,"BSCALE",1.0,0,comm,status);
LAB_001a35de:
  return *status;
}

Assistant:

int ffphprll( fitsfile *fptr, /* I - FITS file pointer                        */
            int simple,     /* I - does file conform to FITS standard? 1/0  */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            LONGLONG naxes[], /* I - length of each data axis                 */
            LONGLONG pcount,  /* I - number of group parameters (usually 0)   */
            LONGLONG gcount,  /* I - number of random groups (usually 1 or 0) */
            int extend,     /* I - may FITS file have extensions?           */
            int *status)    /* IO - error status                            */
/*
  write required primary header keywords
*/
{
    int ii;
    long longbitpix, tnaxes[20];
    char name[FLEN_KEYWORD], comm[FLEN_COMMENT], message[FLEN_ERRMSG];
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);

    if (naxis != 0)   /* never try to compress a null image */
    {
      if ( (fptr->Fptr)->request_compress_type )
      {
      
       for (ii = 0; ii < naxis; ii++)
           tnaxes[ii] = (long) naxes[ii];
	   
        /* write header for a compressed image */
        imcomp_init_table(fptr, bitpix, naxis, tnaxes, 1, status);
        return(*status);
      }
    }  

    if ((fptr->Fptr)->curhdu == 0)
    {                /* write primary array header */
        if (simple)
            strcpy(comm, "file does conform to FITS standard");
        else
            strcpy(comm, "file does not conform to FITS standard");

        ffpkyl(fptr, "SIMPLE", simple, comm, status);
    }
    else
    {               /* write IMAGE extension header */
        strcpy(comm, "IMAGE extension");
        ffpkys(fptr, "XTENSION", "IMAGE", comm, status);
    }

    longbitpix = bitpix;

    /* test for the 3 special cases that represent unsigned integers */
    if (longbitpix == USHORT_IMG)
        longbitpix = SHORT_IMG;
    else if (longbitpix == ULONG_IMG)
        longbitpix = LONG_IMG;
    else if (longbitpix == ULONGLONG_IMG)
        longbitpix = LONGLONG_IMG;
    else if (longbitpix == SBYTE_IMG)
        longbitpix = BYTE_IMG;

    if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG && 
        longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
        longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(message);
        return(*status = BAD_BITPIX);
    }

    strcpy(comm, "number of bits per data pixel");
    if (ffpkyj(fptr, "BITPIX", longbitpix, comm, status) > 0)
        return(*status);

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    strcpy(comm, "number of data axes");
    ffpkyj(fptr, "NAXIS", naxis, comm, status);

    strcpy(comm, "length of data axis ");
    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Illegal negative value for NAXIS%d keyword: %.0f", ii + 1, (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        snprintf(&comm[20], FLEN_COMMENT-20,"%d", ii + 1);
        ffkeyn("NAXIS", ii + 1, name, status);
        ffpkyj(fptr, name, naxes[ii], comm, status);
    }

    if ((fptr->Fptr)->curhdu == 0)  /* the primary array */
    {
        if (extend)
        {
            /* only write EXTEND keyword if value = true */
            strcpy(comm, "FITS dataset may contain extensions");
            ffpkyl(fptr, "EXTEND", extend, comm, status);
        }

        if (pcount < 0)
        {
            ffpmsg("pcount value is less than 0");
            return(*status = BAD_PCOUNT);
        }

        else if (gcount < 1)
        {
            ffpmsg("gcount value is less than 1");
            return(*status = BAD_GCOUNT);
        }

        else if (pcount > 0 || gcount > 1)
        {
            /* only write these keyword if non-standard values */
            strcpy(comm, "random group records are present");
            ffpkyl(fptr, "GROUPS", 1, comm, status);

            strcpy(comm, "number of random group parameters");
            ffpkyj(fptr, "PCOUNT", pcount, comm, status);
  
            strcpy(comm, "number of random groups");
            ffpkyj(fptr, "GCOUNT", gcount, comm, status);
        }

      /* write standard block of self-documentating comments */
/*    ffprec(fptr,
      "COMMENT   FITS (Flexible Image Transport System) format is defined in 'Astronomy",
      status);
      ffprec(fptr,
      "COMMENT   and Astrophysics', volume 376, page 359; bibcode: 2001A&A...376..359H",
      status); */
    }

    else  /* an IMAGE extension */

    {   /* image extension; cannot have random groups */
        if (pcount != 0)
        {
            ffpmsg("image extensions must have pcount = 0");
            *status = BAD_PCOUNT;
        }

        else if (gcount != 1)
        {
            ffpmsg("image extensions must have gcount = 1");
            *status = BAD_GCOUNT;
        }

        else
        {
            strcpy(comm, "required keyword; must = 0");
            ffpkyj(fptr, "PCOUNT", 0, comm, status);
  
            strcpy(comm, "required keyword; must = 1");
            ffpkyj(fptr, "GCOUNT", 1, comm, status);
        }
    }

    /* Write the BSCALE and BZERO keywords, if an unsigned integer image */
    if (bitpix == USHORT_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned short");
        ffpkyg(fptr, "BZERO", 32768., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == ULONG_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned long");
        ffpkyg(fptr, "BZERO", 2147483648., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == ULONGLONG_IMG)
    {
        strcpy(card,"BZERO   =  9223372036854775808 / offset data range to that of unsigned long long");
        ffprec(fptr, card, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == SBYTE_IMG)
    {
        strcpy(comm, "offset data range to that of signed byte");
        ffpkyg(fptr, "BZERO", -128., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    return(*status);
}